

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O3

int IDASetEpsLin(void *ida_mem,sunrealtype eplifac)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDALsMem local_28;
  IDAMem local_20;
  double local_18;
  
  local_18 = eplifac;
  iVar1 = idaLs_AccessLMem(ida_mem,"IDASetEpsLin",&local_20,&local_28);
  if (iVar1 == 0) {
    if (0.0 <= local_18) {
      local_28->eplifac =
           (sunrealtype)
           (~-(ulong)(local_18 == 0.0) & (ulong)local_18 |
           -(ulong)(local_18 == 0.0) & 0x3fa999999999999a);
      iVar1 = 0;
    }
    else {
      iVar1 = -3;
      IDAProcessError(local_20,-3,0x154,"IDASetEpsLin",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                      ,"eplifac < 0.0 illegal.");
    }
  }
  return iVar1;
}

Assistant:

int IDASetEpsLin(void* ida_mem, sunrealtype eplifac)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* Check for legal eplifac */
  if (eplifac < ZERO)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_NEG_EPLIFAC);
    return (IDALS_ILL_INPUT);
  }

  idals_mem->eplifac = (eplifac == ZERO) ? PT05 : eplifac;

  return (IDALS_SUCCESS);
}